

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::DisplayComponents
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,string *name)

{
  uint uVar1;
  FILE *pFVar2;
  bool bVar3;
  undefined8 uVar4;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *this_01;
  uint *puVar6;
  reference ppcVar7;
  const_iterator cStack_50;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  NodeList *nl;
  int c;
  int n;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  string *name_local;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  pFVar2 = _stderr;
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar2,"The strongly connected components for the %s graph are:\n",uVar4);
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  sVar5 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  for (nl._0_4_ = 0; (int)(uint)nl < (int)sVar5; nl._0_4_ = (uint)nl + 1) {
    this_01 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_00,(long)(int)(uint)nl)->super_vector<int,_std::allocator<int>_>;
    fprintf(_stderr,"Component (%d):\n",(ulong)(uint)nl);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
    cStack_50 = std::vector<int,_std::allocator<int>_>::end(this_01);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
      if (!bVar3) break;
      puVar6 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&__end2);
      pFVar2 = _stderr;
      uVar1 = *puVar6;
      ppcVar7 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                operator[](&this->Targets,(long)(int)uVar1);
      cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar7);
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"  contains target %d [%s]\n",(ulong)uVar1,uVar4);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayComponents(
  cmComputeComponentGraph const& ccg, const std::string& name)
{
  fprintf(stderr, "The strongly connected components for the %s graph are:\n",
          name.c_str());
  std::vector<NodeList> const& components = ccg.GetComponents();
  int n = static_cast<int>(components.size());
  for (int c = 0; c < n; ++c) {
    NodeList const& nl = components[c];
    fprintf(stderr, "Component (%d):\n", c);
    for (int i : nl) {
      fprintf(stderr, "  contains target %d [%s]\n", i,
              this->Targets[i]->GetName().c_str());
    }
  }
  fprintf(stderr, "\n");
}